

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxSoundCast::Emit(FxSoundCast *this,VMFunctionBuilder *build)

{
  uint uVar1;
  ExpEmit EVar2;
  ExpEmit EVar3;
  ExpEmit from;
  uint extraout_var;
  
  EVar2._0_4_ = (*this->basex->_vptr_FxExpression[9])();
  EVar2.Konst = (bool)(char)extraout_var;
  EVar2.Fixed = (bool)(char)(extraout_var >> 8);
  EVar2.Final = (bool)(char)(extraout_var >> 0x10);
  EVar2.Target = (bool)(char)(extraout_var >> 0x18);
  from = EVar2;
  if ((extraout_var & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x552,"virtual ExpEmit FxSoundCast::Emit(VMFunctionBuilder *)");
  }
  if (this->basex->ValueType == (PType *)TypeString) {
    ExpEmit::Free(&from,build);
    uVar1 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    VMFunctionBuilder::Emit(build,0x3e,uVar1 & 0xffff,EVar2._0_4_ & 0xffff,0xd);
    EVar3._0_4_ = uVar1 & 0xffff | 0x1000000;
    EVar3.Konst = false;
    EVar3.Fixed = false;
    EVar3.Final = false;
    EVar3.Target = false;
    return EVar3;
  }
  __assert_fail("basex->ValueType == TypeString",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x553,"virtual ExpEmit FxSoundCast::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxSoundCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType == TypeString);
	from.Free(build);
	ExpEmit to(build, REGT_INT);
	build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_S2So);
	return to;
}